

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O0

int bmp_read_4bit(gdImagePtr im,gdIOCtxPtr infile,bmp_info_t *info,bmp_hdr_t *header)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  uint local_48;
  int local_44;
  int current_byte;
  int padding;
  int index;
  int row;
  int xpos;
  int ypos;
  bmp_hdr_t *header_local;
  bmp_info_t *info_local;
  gdIOCtxPtr infile_local;
  gdImagePtr im_local;
  
  row = 0;
  index = 0;
  padding = 0;
  current_byte = 0;
  local_44 = 0;
  local_48 = 0;
  if ((info->enctype == 0) || (info->enctype == 2)) {
    if (info->numcolors == 0) {
      info->numcolors = 0x10;
    }
    else if ((info->numcolors < 0) || (0x10 < info->numcolors)) {
      return 1;
    }
    _xpos = header;
    header_local = (bmp_hdr_t *)info;
    info_local = (bmp_info_t *)infile;
    infile_local = (gdIOCtxPtr)im;
    iVar4 = bmp_read_palette(im,infile,info->numcolors,(uint)(info->type == 2));
    if (iVar4 == 0) {
      *(undefined4 *)&infile_local->putC = *(undefined4 *)&header_local[2].reserved1;
      lVar5 = gdTell((gdIOCtx *)info_local);
      if (lVar5 != _xpos->off) {
        gdSeek((gdIOCtx *)info_local,_xpos->off);
      }
      iVar4._0_2_ = header_local->reserved1;
      iVar4._2_2_ = header_local->reserved2;
      dVar6 = ceil((double)iVar4 * 0.5);
      local_44 = (int)dVar6 % 4;
      if (local_44 != 0) {
        local_44 = 4 - local_44;
      }
      iVar3._0_2_ = header_local[1].reserved1;
      iVar3._2_2_ = header_local[1].reserved2;
      if (iVar3 == 0) {
        for (row = 0; row < header_local->off; row = row + 1) {
          if ((char)header_local[1].magic == '\0') {
            padding = (header_local->off - row) + -1;
          }
          else {
            padding = row;
          }
          for (index = 0; iVar1._0_2_ = header_local->reserved1,
              iVar1._2_2_ = header_local->reserved2, index < iVar1; index = index + 2) {
            iVar4 = gdGetByte((int *)&local_48,(gdIOCtx *)info_local);
            if (iVar4 == 0) {
              return 1;
            }
            current_byte = (int)local_48 >> 4 & 0xf;
            if (*(int *)((long)&infile_local[0x30].putC + (long)current_byte * 4 + 4) != 0) {
              *(undefined4 *)((long)&infile_local[0x30].putC + (long)current_byte * 4 + 4) = 0;
            }
            gdImageSetPixel((gdImagePtr)infile_local,index,padding,current_byte);
            iVar2._0_2_ = header_local->reserved1;
            iVar2._2_2_ = header_local->reserved2;
            if (iVar2 <= index) break;
            current_byte = local_48 & 0xf;
            if (*(int *)((long)&infile_local[0x30].putC + (long)current_byte * 4 + 4) != 0) {
              *(undefined4 *)((long)&infile_local[0x30].putC + (long)current_byte * 4 + 4) = 0;
            }
            gdImageSetPixel((gdImagePtr)infile_local,index + 1,padding,current_byte);
          }
          for (index = local_44; 0 < index; index = index + -1) {
            iVar4 = gdGetByte(&current_byte,(gdIOCtx *)info_local);
            if (iVar4 == 0) {
              return 1;
            }
          }
        }
      }
      else {
        if (iVar3 != 2) {
          return 1;
        }
        iVar4 = bmp_read_rle((gdImagePtr)infile_local,(gdIOCtxPtr)info_local,
                             (bmp_info_t *)header_local);
        if (iVar4 != 0) {
          return 1;
        }
      }
      im_local._4_4_ = 0;
    }
    else {
      im_local._4_4_ = 1;
    }
  }
  else {
    im_local._4_4_ = 1;
  }
  return im_local._4_4_;
}

Assistant:

static int bmp_read_4bit(gdImagePtr im, gdIOCtxPtr infile, bmp_info_t *info, bmp_hdr_t *header)
{
	int ypos = 0, xpos = 0, row = 0, index = 0;
	int padding = 0, current_byte = 0;

	if (info->enctype != BMP_BI_RGB && info->enctype != BMP_BI_RLE4) {
		return 1;
	}

	if (!info->numcolors) {
		info->numcolors = 16;
	} else if (info->numcolors < 0 || info->numcolors > 16) {
		return 1;
	}

	if (bmp_read_palette(im, infile, info->numcolors, (info->type == BMP_PALETTE_4))) {
		return 1;
	}

	im->colorsTotal = info->numcolors;

	/* There is a chance the data isn't until later, would be wierd but it is possible */
	if (gdTell(infile) != header->off) {
		/* Should make sure we don't seek past the file size */
		gdSeek(infile, header->off);
	}

	/* The line must be divisible by 4, else its padded with NULLs */
	padding = ((int)ceil(0.5 * info->width)) % 4;
	if (padding) {
		padding = 4 - padding;
	}

	switch (info->enctype) {
	case BMP_BI_RGB:
		for (ypos = 0; ypos < info->height; ++ypos) {
			if (info->topdown) {
				row = ypos;
			} else {
				row = info->height - ypos - 1;
			}

			for (xpos = 0; xpos < info->width; xpos += 2) {
				if (!gdGetByte(&current_byte, infile)) {
					return 1;
				}

				index = (current_byte >> 4) & 0x0f;
				if (im->open[index]) {
					im->open[index] = 0;
				}
				gdImageSetPixel(im, xpos, row, index);

				/* This condition may get called often, potential optimsations */
				if (xpos >= info->width) {
					break;
				}

				index = current_byte & 0x0f;
				if (im->open[index]) {
					im->open[index] = 0;
				}
				gdImageSetPixel(im, xpos + 1, row, index);
			}

			for (xpos = padding; xpos > 0; --xpos) {
				if (!gdGetByte(&index, infile)) {
					return 1;
				}
			}
		}
		break;

	case BMP_BI_RLE4:
		if (bmp_read_rle(im, infile, info)) {
			return 1;
		}
		break;

	default:
		return 1;
	}
	return 0;
}